

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterMergeTreeBuild(VdbeSorter *pSorter,MergeEngine **ppOut)

{
  bool bVar1;
  int iSeq_00;
  int local_64;
  MergeEngine *pMStack_58;
  int nReader;
  MergeEngine *pMerger;
  int iSeq;
  int i;
  i64 iReadOff;
  MergeEngine *pMStack_38;
  int nDepth;
  MergeEngine *pRoot;
  SortSubtask *pTask;
  int iTask;
  int rc;
  MergeEngine *pMain;
  MergeEngine **ppOut_local;
  VdbeSorter *pSorter_local;
  
  _iTask = (MergeEngine *)0x0;
  pTask._4_4_ = 0;
  pMain = (MergeEngine *)ppOut;
  ppOut_local = (MergeEngine **)pSorter;
  if ((1 < pSorter->nTask) &&
     (_iTask = vdbeMergeEngineNew((uint)pSorter->nTask), _iTask == (MergeEngine *)0x0)) {
    pTask._4_4_ = 7;
  }
  pTask._0_4_ = 0;
  while( true ) {
    bVar1 = false;
    if (pTask._4_4_ == 0) {
      bVar1 = (int)pTask < (int)(uint)*(byte *)((long)ppOut_local + 0x5b);
    }
    if (!bVar1) break;
    pRoot = (MergeEngine *)(ppOut_local + (long)(int)pTask * 0xd + 0xc);
    if (*(int *)&pRoot[1].aReadr != 0) {
      pMStack_38 = (MergeEngine *)0x0;
      iReadOff._4_4_ = vdbeSorterTreeDepth(*(int *)&pRoot[1].aReadr);
      _iSeq = 0;
      if (*(int *)&pRoot[1].aReadr < 0x11) {
        pTask._4_4_ = vdbeMergeEngineLevel0
                                ((SortSubtask *)pRoot,*(int *)&pRoot[1].aReadr,(i64 *)&iSeq,
                                 &stack0xffffffffffffffc8);
      }
      else {
        pMerger._0_4_ = 0;
        pMStack_38 = vdbeMergeEngineNew(0x10);
        if (pMStack_38 == (MergeEngine *)0x0) {
          pTask._4_4_ = 7;
        }
        for (pMerger._4_4_ = 0; pMerger._4_4_ < *(int *)&pRoot[1].aReadr && pTask._4_4_ == 0;
            pMerger._4_4_ = pMerger._4_4_ + 0x10) {
          pMStack_58 = (MergeEngine *)0x0;
          if (*(int *)&pRoot[1].aReadr - pMerger._4_4_ < 0x10) {
            local_64 = *(int *)&pRoot[1].aReadr - pMerger._4_4_;
          }
          else {
            local_64 = 0x10;
          }
          pTask._4_4_ = vdbeMergeEngineLevel0
                                  ((SortSubtask *)pRoot,local_64,(i64 *)&iSeq,
                                   &stack0xffffffffffffffa8);
          iSeq_00 = (int)pMerger;
          if (pTask._4_4_ == 0) {
            pMerger._0_4_ = (int)pMerger + 1;
            pTask._4_4_ = vdbeSorterAddToTree((SortSubtask *)pRoot,iReadOff._4_4_,iSeq_00,pMStack_38
                                              ,pMStack_58);
          }
        }
      }
      if (pTask._4_4_ == 0) {
        if (_iTask == (MergeEngine *)0x0) {
          _iTask = pMStack_38;
        }
        else {
          pTask._4_4_ = vdbeIncrMergerNew((SortSubtask *)pRoot,pMStack_38,
                                          &_iTask->aReadr[(int)pTask].pIncr);
        }
      }
      else {
        vdbeMergeEngineFree(pMStack_38);
      }
    }
    pTask._0_4_ = (int)pTask + 1;
  }
  if (pTask._4_4_ != 0) {
    vdbeMergeEngineFree(_iTask);
    _iTask = (MergeEngine *)0x0;
  }
  *(MergeEngine **)pMain = _iTask;
  return pTask._4_4_;
}

Assistant:

static int vdbeSorterMergeTreeBuild(
  VdbeSorter *pSorter,       /* The VDBE cursor that implements the sort */
  MergeEngine **ppOut        /* Write the MergeEngine here */
){
  MergeEngine *pMain = 0;
  int rc = SQLITE_OK;
  int iTask;

#if SQLITE_MAX_WORKER_THREADS>0
  /* If the sorter uses more than one task, then create the top-level 
  ** MergeEngine here. This MergeEngine will read data from exactly 
  ** one PmaReader per sub-task.  */
  assert( pSorter->bUseThreads || pSorter->nTask==1 );
  if( pSorter->nTask>1 ){
    pMain = vdbeMergeEngineNew(pSorter->nTask);
    if( pMain==0 ) rc = SQLITE_NOMEM_BKPT;
  }
#endif

  for(iTask=0; rc==SQLITE_OK && iTask<pSorter->nTask; iTask++){
    SortSubtask *pTask = &pSorter->aTask[iTask];
    assert( pTask->nPMA>0 || SQLITE_MAX_WORKER_THREADS>0 );
    if( SQLITE_MAX_WORKER_THREADS==0 || pTask->nPMA ){
      MergeEngine *pRoot = 0;     /* Root node of tree for this task */
      int nDepth = vdbeSorterTreeDepth(pTask->nPMA);
      i64 iReadOff = 0;

      if( pTask->nPMA<=SORTER_MAX_MERGE_COUNT ){
        rc = vdbeMergeEngineLevel0(pTask, pTask->nPMA, &iReadOff, &pRoot);
      }else{
        int i;
        int iSeq = 0;
        pRoot = vdbeMergeEngineNew(SORTER_MAX_MERGE_COUNT);
        if( pRoot==0 ) rc = SQLITE_NOMEM_BKPT;
        for(i=0; i<pTask->nPMA && rc==SQLITE_OK; i += SORTER_MAX_MERGE_COUNT){
          MergeEngine *pMerger = 0; /* New level-0 PMA merger */
          int nReader;              /* Number of level-0 PMAs to merge */

          nReader = MIN(pTask->nPMA - i, SORTER_MAX_MERGE_COUNT);
          rc = vdbeMergeEngineLevel0(pTask, nReader, &iReadOff, &pMerger);
          if( rc==SQLITE_OK ){
            rc = vdbeSorterAddToTree(pTask, nDepth, iSeq++, pRoot, pMerger);
          }
        }
      }

      if( rc==SQLITE_OK ){
#if SQLITE_MAX_WORKER_THREADS>0
        if( pMain!=0 ){
          rc = vdbeIncrMergerNew(pTask, pRoot, &pMain->aReadr[iTask].pIncr);
        }else
#endif
        {
          assert( pMain==0 );
          pMain = pRoot;
        }
      }else{
        vdbeMergeEngineFree(pRoot);
      }
    }
  }

  if( rc!=SQLITE_OK ){
    vdbeMergeEngineFree(pMain);
    pMain = 0;
  }
  *ppOut = pMain;
  return rc;
}